

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O1

string * util::fs::get_cwd_string_abi_cxx11_(void)

{
  char *__buf;
  char *pcVar1;
  Exception *this;
  string *in_RDI;
  ulong __size;
  string local_50;
  
  __size = 0x100;
  do {
    __buf = (char *)operator_new__(__size);
    pcVar1 = getcwd(__buf,__size);
    if (pcVar1 == __buf) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      strlen(__buf);
      std::__cxx11::string::_M_construct<char_const*>();
      operator_delete__(__buf);
    }
    else {
      operator_delete__(__buf);
      __size = __size * 2;
      if (0x8000 < __size) {
        this = (Exception *)__cxa_allocate_exception(0x28);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Error storing CWD","");
        Exception::Exception(this,&local_50);
        __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
      }
    }
  } while (pcVar1 != __buf);
  return in_RDI;
}

Assistant:

std::string
get_cwd_string (void)
{
    std::size_t size = 1 << 8;
    while (true)
    {
        char* buf = new char[size];
        if (get_cwd(buf, size) == buf)
        {
            std::string ret(buf);
            delete[] buf;
            return ret;
        }
        delete[] buf;
        size = size << 1;
        if (size > (1 << 15))
            throw Exception("Error storing CWD");
    }
}